

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfPost.c
# Opt level: O3

void Cnf_ManFreeCuts(Cnf_Man_t *p)

{
  void *pvVar1;
  Aig_Man_t *pAVar2;
  Vec_Ptr_t *pVVar3;
  long lVar4;
  
  pAVar2 = p->pManAig;
  pVVar3 = pAVar2->vObjs;
  if (0 < pVVar3->nSize) {
    lVar4 = 0;
    do {
      pvVar1 = pVVar3->pArray[lVar4];
      if ((pvVar1 != (void *)0x0) && (*(Cnf_Cut_t **)((long)pvVar1 + 0x28) != (Cnf_Cut_t *)0x0)) {
        Cnf_CutFree(*(Cnf_Cut_t **)((long)pvVar1 + 0x28));
        *(undefined8 *)((long)pvVar1 + 0x28) = 0;
        pAVar2 = p->pManAig;
      }
      lVar4 = lVar4 + 1;
      pVVar3 = pAVar2->vObjs;
    } while (lVar4 < pVVar3->nSize);
  }
  return;
}

Assistant:

void Cnf_ManFreeCuts( Cnf_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    Aig_ManForEachObj( p->pManAig, pObj, i )
        if ( pObj->pData )
        {
            Cnf_CutFree( (Cnf_Cut_t *)pObj->pData );
            pObj->pData = NULL;
        }
}